

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mat.h
# Opt level: O1

Mat * __thiscall ncnn::Mat::channel(Mat *__return_storage_ptr__,Mat *this,int _c)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  Allocator *pAVar5;
  Mat *m;
  int iVar6;
  bool bVar7;
  
  bVar7 = this->dims == 3;
  iVar1 = this->w;
  iVar2 = this->h;
  iVar6 = 1;
  if (!bVar7) {
    iVar6 = this->d;
  }
  sVar4 = this->elemsize;
  iVar3 = this->elempack;
  pAVar5 = this->allocator;
  __return_storage_ptr__->data = (void *)((long)_c * this->cstep * sVar4 + (long)this->data);
  __return_storage_ptr__->refcount = (int *)0x0;
  __return_storage_ptr__->elemsize = sVar4;
  __return_storage_ptr__->elempack = iVar3;
  __return_storage_ptr__->allocator = pAVar5;
  __return_storage_ptr__->dims = bVar7 ^ 3;
  __return_storage_ptr__->w = iVar1;
  __return_storage_ptr__->h = iVar2;
  __return_storage_ptr__->d = 1;
  __return_storage_ptr__->c = iVar6;
  __return_storage_ptr__->cstep = (long)iVar2 * (long)iVar1;
  return __return_storage_ptr__;
}

Assistant:

inline Mat Mat::channel(int _c)
{
    if (dims == 3)
        return Mat(w, h, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);

    // if (dims == 4)
    Mat m(w, h, d, (unsigned char*)data + cstep * _c * elemsize, elemsize, elempack, allocator);
    m.cstep = (size_t)w * h;
    return m;
}